

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyorigin.h
# Opt level: O2

void KeyOriginInfo::SerializationOps<DataStream,KeyOriginInfo_const,ActionSerialize>
               (uchar (*obj) [4],DataStream *s)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SerializeMany<DataStream,unsigned_char[4],std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (s,obj,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(obj + 2));
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(KeyOriginInfo, obj) { READWRITE(obj.fingerprint, obj.path); }